

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.cpp
# Opt level: O0

void ncnn::quantize(float *ptr,char *s8ptr,float scale,int size)

{
  char cVar1;
  int in_EDX;
  char *in_RSI;
  int i;
  float in_stack_ffffffffffffffe0;
  int local_1c;
  char *local_10;
  
  local_10 = in_RSI;
  for (local_1c = 0; local_1c < in_EDX; local_1c = local_1c + 1) {
    cVar1 = float2int8(in_stack_ffffffffffffffe0);
    *local_10 = cVar1;
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

static void quantize(const float* ptr, signed char* s8ptr, float scale, int size)
{
    for (int i = 0; i < size; i++)
    {
        *s8ptr = float2int8(*ptr * scale);
        ptr++;
        s8ptr++;
    }
}